

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

void __thiscall
chrono::ChLoaderXYZnode::ChLoaderXYZnode
          (ChLoaderXYZnode *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  double dVar1;
  __shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &mloadable->super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
  ChLoaderUVWatomic::ChLoaderUVWatomic
            (&this->super_ChLoaderUVWatomic,(shared_ptr<chrono::ChLoadableUVW> *)&local_20,0.0,0.0,
             0.0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_ChLoaderUVWatomic).super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_01176ba0;
  dVar1 = DAT_011dd3e0;
  (this->force).m_data[0] = VNULL;
  (this->force).m_data[1] = dVar1;
  (this->force).m_data[2] = DAT_011dd3e8;
  return;
}

Assistant:

ChLoaderXYZnode(std::shared_ptr<ChLoadableUVW> mloadable) : ChLoaderUVWatomic(mloadable, 0, 0, 0), force(VNULL) {}